

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void AnalyzeClassFunctionElements
               (ExpressionContext *ctx,ExprClassDefinition *classDefinition,SynClassElements *syntax
               )

{
  Lexeme *begin;
  Lexeme *end;
  char *pcVar1;
  char *pcVar2;
  IntrusiveList<TypeHandle> arguments_00;
  int iVar3;
  ExprBase *pEVar4;
  undefined4 extraout_var;
  TypeBase *returnType;
  SynBase *pSVar6;
  SynFunctionDefinition *pSVar7;
  TypeFunction *pTVar8;
  SynIdentifier *pSVar9;
  SynFunctionArgument *node;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TypeHandle *node_00;
  SynError *error;
  SynAccessor *pSVar10;
  SynClassStaticIf *syntax_00;
  IntrusiveList<TypeHandle> argTypes;
  IntrusiveList<SynBase> expressions;
  IntrusiveList<SynBase> expressions_1;
  IntrusiveList<SynFunctionArgument> arguments;
  IntrusiveList<TypeHandle> local_d8;
  SynClassElements *local_c8;
  ExprClassDefinition *local_c0;
  IntrusiveList<SynBase> local_b8;
  IntrusiveList<ExprBase> *local_a8;
  SynBase *local_a0;
  IntrusiveList<SynBase> local_98;
  ExpressionContext *local_88;
  TypeBase *local_80;
  IntrusiveList<SynFunctionArgument> local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  SynBase *pSVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_07;
  
  pSVar7 = (syntax->functions).head;
  local_c8 = syntax;
  if (pSVar7 != (SynFunctionDefinition *)0x0) {
    do {
      local_48 = 0;
      uStack_40 = 0;
      pEVar4 = AnalyzeFunctionDefinition
                         (ctx,pSVar7,(FunctionData *)0x0,(TypeFunction *)0x0,(TypeBase *)0x0,
                          (IntrusiveList<MatchData>)ZEXT816(0),false,false,true);
      IntrusiveList<ExprBase>::push_back(&classDefinition->functions,pEVar4);
      pSVar7 = (SynFunctionDefinition *)(pSVar7->super_SynBase).next;
      if (pSVar7 == (SynFunctionDefinition *)0x0) break;
    } while ((pSVar7->super_SynBase).typeID == 0x37);
  }
  pSVar10 = (local_c8->accessors).head;
  if (pSVar10 != (SynAccessor *)0x0) {
    local_a8 = &classDefinition->functions;
    local_c0 = classDefinition;
    local_88 = ctx;
    do {
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
      pSVar5 = (SynBase *)CONCAT44(extraout_var,iVar3);
      pcVar1 = (classDefinition->classType->super_TypeStruct).super_TypeBase.name.begin;
      pcVar2 = (classDefinition->classType->super_TypeStruct).super_TypeBase.name.end;
      local_d8.head._0_4_ = SUB84(pcVar1,0);
      local_d8.head._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
      local_d8.tail._0_4_ = SUB84(pcVar2,0);
      local_d8.tail._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
      SynBase::SynBase(pSVar5,7,(pSVar10->super_SynBase).begin,(pSVar10->super_SynBase).end);
      pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6cf8;
      pSVar5[1]._vptr_SynBase = (_func_int **)0x0;
      *(undefined8 *)&pSVar5[1].typeID = 0;
      pSVar5[1].begin = (Lexeme *)CONCAT44(local_d8.head._4_4_,local_d8.head._0_4_);
      pSVar5[1].end = (Lexeme *)CONCAT44(local_d8.tail._4_4_,local_d8.tail._0_4_);
      local_a0 = pSVar5;
      returnType = AnalyzeType(ctx,pSVar10->type,true,(bool *)0x0);
      pSVar5 = pSVar10->getBlock;
      if ((pSVar5 != (SynBase *)0x0) &&
         ((returnType == (TypeBase *)0x0 || (returnType->typeID != 0)))) {
        local_b8.head = (SynBase *)0x0;
        local_b8.tail = (SynBase *)0x0;
        if (pSVar5->typeID == 0) {
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
          pSVar6 = (SynBase *)CONCAT44(extraout_var_00,iVar3);
          SynBase::SynBase(pSVar6,0,pSVar5->begin,pSVar5->end);
          pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
          IntrusiveList<SynBase>::push_back(&local_b8,pSVar6);
        }
        else if (pSVar5->typeID == 0x26) {
          local_b8.head = (SynBase *)pSVar5[1]._vptr_SynBase;
          local_b8.tail = *(SynBase **)&pSVar5[1].typeID;
        }
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x98);
        pSVar7 = (SynFunctionDefinition *)CONCAT44(extraout_var_01,iVar3);
        pSVar5 = pSVar10->type;
        pSVar9 = pSVar10->name;
        local_d8.head._0_4_ = SUB84(local_b8.head,0);
        local_d8.head._4_4_ = (undefined4)((ulong)local_b8.head >> 0x20);
        local_d8.tail._0_4_ = SUB84(local_b8.tail,0);
        local_d8.tail._4_4_ = (undefined4)((ulong)local_b8.tail >> 0x20);
        SynBase::SynBase((SynBase *)pSVar7,0x37,(pSVar10->super_SynBase).begin,
                         (pSVar10->super_SynBase).end);
        (pSVar7->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d68;
        *(undefined2 *)&(pSVar7->super_SynBase).field_0x3a = 0;
        pSVar7->parentType = local_a0;
        pSVar7->accessor = true;
        pSVar7->returnType = pSVar5;
        pSVar7->isOperator = false;
        pSVar7->name = pSVar9;
        (pSVar7->aliases).head = (SynIdentifier *)0x0;
        (pSVar7->aliases).tail = (SynIdentifier *)0x0;
        (pSVar7->arguments).head = (SynFunctionArgument *)0x0;
        (pSVar7->arguments).tail = (SynFunctionArgument *)0x0;
        (pSVar7->expressions).head = (SynBase *)CONCAT44(local_d8.head._4_4_,local_d8.head._0_4_);
        (pSVar7->expressions).tail = (SynBase *)CONCAT44(local_d8.tail._4_4_,local_d8.tail._0_4_);
        pTVar8 = ExpressionContext::GetFunctionType
                           (ctx,&local_c8->super_SynBase,returnType,
                            (IntrusiveList<TypeHandle>)ZEXT816(0));
        local_58 = 0;
        uStack_50 = 0;
        pEVar4 = AnalyzeFunctionDefinition
                           (ctx,pSVar7,(FunctionData *)0x0,pTVar8,(TypeBase *)0x0,
                            (IntrusiveList<MatchData>)ZEXT816(0),false,false,false);
        classDefinition = local_c0;
        if ((pEVar4 != (ExprBase *)0x0) && (pEVar4->typeID == 0x24)) {
          returnType = *(TypeBase **)(pEVar4[1]._vptr_ExprBase[5] + 0x60);
        }
        IntrusiveList<ExprBase>::push_back(local_a8,pEVar4);
      }
      if ((pSVar10->setBlock != (SynBase *)0x0) &&
         ((returnType == (TypeBase *)0x0 || (returnType->typeID != 0)))) {
        local_78.head = (SynFunctionArgument *)0x0;
        local_78.tail = (SynFunctionArgument *)0x0;
        pSVar9 = pSVar10->setName;
        local_80 = returnType;
        if (pSVar9 == (SynIdentifier *)0x0) {
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar9 = (SynIdentifier *)CONCAT44(extraout_var_02,iVar3);
          (pSVar9->super_SynBase).typeID = 4;
          (pSVar9->super_SynBase).begin = (Lexeme *)0x0;
          (pSVar9->super_SynBase).end = (Lexeme *)0x0;
          (pSVar9->super_SynBase).pos.begin = (char *)0x0;
          (pSVar9->super_SynBase).pos.end = (char *)0x0;
          *(undefined8 *)((long)&(pSVar9->super_SynBase).pos.end + 2) = 0;
          *(undefined8 *)((long)&(pSVar9->super_SynBase).next + 2) = 0;
          (pSVar9->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
          (pSVar9->name).begin = "r";
          (pSVar9->name).end = "";
        }
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
        node = (SynFunctionArgument *)CONCAT44(extraout_var_03,iVar3);
        pSVar5 = pSVar10->type;
        SynBase::SynBase((SynBase *)node,0x36,(pSVar10->super_SynBase).begin,
                         (pSVar10->super_SynBase).end);
        (node->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6da0;
        (node->super_SynBase).field_0x3a = 0;
        node->type = pSVar5;
        node->name = pSVar9;
        node->initializer = (SynBase *)0x0;
        IntrusiveList<SynFunctionArgument>::push_back(&local_78,node);
        local_98.head = (SynBase *)0x0;
        local_98.tail = (SynBase *)0x0;
        pSVar5 = pSVar10->setBlock;
        if (pSVar5 != (SynBase *)0x0) {
          if (pSVar5->typeID == 0) {
            iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
            pSVar6 = (SynBase *)CONCAT44(extraout_var_04,iVar3);
            SynBase::SynBase(pSVar6,0,pSVar5->begin,pSVar5->end);
            pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
            IntrusiveList<SynBase>::push_back(&local_98,pSVar6);
          }
          else if (pSVar5->typeID == 0x26) {
            local_98.head = (SynBase *)pSVar5[1]._vptr_SynBase;
            local_98.tail = *(SynBase **)&pSVar5[1].typeID;
          }
        }
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x98);
        pSVar7 = (SynFunctionDefinition *)CONCAT44(extraout_var_05,iVar3);
        begin = (pSVar10->super_SynBase).begin;
        end = (pSVar10->super_SynBase).end;
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pSVar5 = (SynBase *)CONCAT44(extraout_var_06,iVar3);
        SynBase::SynBase(pSVar5,5,(pSVar10->super_SynBase).begin,(pSVar10->super_SynBase).end);
        pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6dd8;
        pSVar9 = pSVar10->name;
        local_b8.head = &(local_78.head)->super_SynBase;
        local_b8.tail = &(local_78.tail)->super_SynBase;
        local_d8.head._0_4_ = SUB84(local_98.head,0);
        local_d8.head._4_4_ = (undefined4)((ulong)local_98.head >> 0x20);
        local_d8.tail._0_4_ = SUB84(local_98.tail,0);
        local_d8.tail._4_4_ = (undefined4)((ulong)local_98.tail >> 0x20);
        SynBase::SynBase((SynBase *)pSVar7,0x37,begin,end);
        ctx = local_88;
        (pSVar7->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d68;
        *(undefined2 *)&(pSVar7->super_SynBase).field_0x3a = 0;
        pSVar7->parentType = local_a0;
        pSVar7->accessor = true;
        pSVar7->returnType = pSVar5;
        pSVar7->isOperator = false;
        pSVar7->name = pSVar9;
        (pSVar7->aliases).head = (SynIdentifier *)0x0;
        (pSVar7->aliases).tail = (SynIdentifier *)0x0;
        (pSVar7->arguments).head = (SynFunctionArgument *)local_b8.head;
        (pSVar7->arguments).tail = (SynFunctionArgument *)local_b8.tail;
        *(undefined4 *)&(pSVar7->expressions).head = local_d8.head._0_4_;
        *(undefined4 *)((long)&(pSVar7->expressions).head + 4) = local_d8.head._4_4_;
        *(undefined4 *)&(pSVar7->expressions).tail = local_d8.tail._0_4_;
        *(undefined4 *)((long)&(pSVar7->expressions).tail + 4) = local_d8.tail._4_4_;
        local_d8.head._0_4_ = 0;
        local_d8.head._4_4_ = 0;
        local_d8.tail._0_4_ = 0;
        local_d8.tail._4_4_ = 0;
        iVar3 = (*local_88->allocator->_vptr_Allocator[2])(local_88->allocator,0x18);
        node_00 = (TypeHandle *)CONCAT44(extraout_var_07,iVar3);
        node_00->type = local_80;
        node_00->next = (TypeHandle *)0x0;
        node_00->listed = false;
        IntrusiveList<TypeHandle>::push_back(&local_d8,node_00);
        arguments_00.head._4_4_ = local_d8.head._4_4_;
        arguments_00.head._0_4_ = local_d8.head._0_4_;
        arguments_00.tail._0_4_ = local_d8.tail._0_4_;
        arguments_00.tail._4_4_ = local_d8.tail._4_4_;
        pTVar8 = ExpressionContext::GetFunctionType
                           (ctx,&local_c8->super_SynBase,ctx->typeAuto,arguments_00);
        local_68 = 0;
        uStack_60 = 0;
        pEVar4 = AnalyzeFunctionDefinition
                           (ctx,pSVar7,(FunctionData *)0x0,pTVar8,(TypeBase *)0x0,
                            (IntrusiveList<MatchData>)ZEXT816(0),false,false,false);
        IntrusiveList<ExprBase>::push_back(local_a8,pEVar4);
        classDefinition = local_c0;
      }
      pSVar10 = (SynAccessor *)(pSVar10->super_SynBase).next;
    } while ((pSVar10 != (SynAccessor *)0x0) && ((pSVar10->super_SynBase).typeID == 0x35));
  }
  syntax_00 = (local_c8->staticIfs).head;
  if (syntax_00 != (SynClassStaticIf *)0x0) {
    do {
      AnalyzeClassStaticIf(ctx,classDefinition,syntax_00,false);
      syntax_00 = (SynClassStaticIf *)(syntax_00->super_SynBase).next;
      if (syntax_00 == (SynClassStaticIf *)0x0) {
        return;
      }
    } while ((syntax_00->super_SynBase).typeID == 0x3d);
  }
  return;
}

Assistant:

void AnalyzeClassFunctionElements(ExpressionContext &ctx, ExprClassDefinition *classDefinition, SynClassElements *syntax)
{
	for(SynFunctionDefinition *function = syntax->functions.head; function; function = getType<SynFunctionDefinition>(function->next))
		classDefinition->functions.push_back(AnalyzeFunctionDefinition(ctx, function, NULL, NULL, NULL, IntrusiveList<MatchData>(), false, false, true));

	for(SynAccessor *accessor = syntax->accessors.head; accessor; accessor = getType<SynAccessor>(accessor->next))
	{
		SynBase *parentType = new (ctx.get<SynTypeSimple>()) SynTypeSimple(accessor->begin, accessor->end, IntrusiveList<SynIdentifier>(), classDefinition->classType->name);

		TypeBase *accessorType = AnalyzeType(ctx, accessor->type);

		if(accessor->getBlock && !isType<TypeError>(accessorType))
		{
			IntrusiveList<SynIdentifier> aliases;
			IntrusiveList<SynFunctionArgument> arguments;

			IntrusiveList<SynBase> expressions;

			if(SynBlock *block = getType<SynBlock>(accessor->getBlock))
				expressions = block->expressions;
			else if(SynError *error = getType<SynError>(accessor->getBlock))
				expressions.push_back(new (ctx.get<SynError>()) SynError(error->begin, error->end));

			SynFunctionDefinition *function = new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(accessor->begin, accessor->end, false, false, parentType, true, accessor->type, false, accessor->name, aliases, arguments, expressions);

			TypeFunction *instance = ctx.GetFunctionType(syntax, accessorType, IntrusiveList<TypeHandle>());

			ExprBase *definition = AnalyzeFunctionDefinition(ctx, function, NULL, instance, NULL, IntrusiveList<MatchData>(), false, false, false);

			if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(definition))
				accessorType = node->function->type->returnType;

			classDefinition->functions.push_back(definition);
		}

		if(accessor->setBlock && !isType<TypeError>(accessorType))
		{
			IntrusiveList<SynIdentifier> aliases;

			IntrusiveList<SynFunctionArgument> arguments;

			SynIdentifier *setName = accessor->setName;

			if(!setName)
				setName = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("r"));

			arguments.push_back(new (ctx.get<SynFunctionArgument>()) SynFunctionArgument(accessor->begin, accessor->end, false, accessor->type, setName, NULL));

			IntrusiveList<SynBase> expressions;

			if(SynBlock *block = getType<SynBlock>(accessor->setBlock))
				expressions = block->expressions;
			else if(SynError *error = getType<SynError>(accessor->setBlock))
				expressions.push_back(new (ctx.get<SynError>()) SynError(error->begin, error->end));

			SynFunctionDefinition *function = new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(accessor->begin, accessor->end, false, false, parentType, true, new (ctx.get<SynTypeAuto>()) SynTypeAuto(accessor->begin, accessor->end), false, accessor->name, aliases, arguments, expressions);

			IntrusiveList<TypeHandle> argTypes;
			argTypes.push_back(new (ctx.get<TypeHandle>()) TypeHandle(accessorType));

			TypeFunction *instance = ctx.GetFunctionType(syntax, ctx.typeAuto, argTypes);

			classDefinition->functions.push_back(AnalyzeFunctionDefinition(ctx, function, NULL, instance, NULL, IntrusiveList<MatchData>(), false, false, false));
		}
	}

	for(SynClassStaticIf *staticIf = syntax->staticIfs.head; staticIf; staticIf = getType<SynClassStaticIf>(staticIf->next))
		AnalyzeClassStaticIf(ctx, classDefinition, staticIf, false);
}